

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Function * __thiscall soul::PoolAllocator::allocate<soul::heart::Function>(PoolAllocator *this)

{
  void **this_00;
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0xe0);
  this_00 = &pPVar1->item;
  memset(this_00,0,0xe0);
  heart::Function::Function((Function *)this_00);
  pPVar1->destructor = allocate<soul::heart::Function>::anon_class_1_0_00000001::__invoke;
  return (Function *)this_00;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }